

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_IsExtensible(JSContext *ctx,JSValue obj)

{
  int iVar1;
  
  if ((int)obj.tag != -1) {
    return 0;
  }
  if (*(short *)((long)obj.u.ptr + 6) != 0x29) {
    return *(byte *)((long)obj.u.ptr + 5) & 1;
  }
  iVar1 = js_proxy_isExtensible(ctx,obj);
  return iVar1;
}

Assistant:

int JS_IsExtensible(JSContext *ctx, JSValueConst obj)
{
    JSObject *p;

    if (unlikely(JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    if (unlikely(p->class_id == JS_CLASS_PROXY))
        return js_proxy_isExtensible(ctx, obj);
    else
        return p->extensible;
}